

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

bool __thiscall cmMakefile::ReadDependentFile(cmMakefile *this,char *filename,bool noPolicyScope)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Alloc_hider filename_00;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  cmMessenger *messenger;
  string filenametoread;
  cmListFile listFile;
  IncludeScope incScope;
  allocator local_99;
  string local_98;
  undefined1 local_78 [48];
  undefined1 local_48 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  local_78._0_8_ = local_78 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"CMAKE_PARENT_LIST_FILE","");
  paVar1 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"CMAKE_CURRENT_LIST_FILE","");
  pcVar4 = GetDefinition(this,&local_98);
  AddDefinition(this,(string *)local_78,pcVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  std::__cxx11::string::string((string *)local_48,filename,&local_99);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_78,&this->StateSnapshot);
  pcVar4 = cmStateDirectory::GetCurrentSource((cmStateDirectory *)local_78);
  cmsys::SystemTools::CollapseFullPath(&local_98,(string *)local_48,pcVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._0_8_ != &local_38) {
    operator_delete((void *)local_48._0_8_,local_38._M_allocated_capacity + 1);
  }
  IncludeScope::IncludeScope((IncludeScope *)local_48,this,&local_98,noPolicyScope);
  filename_00._M_p = local_98._M_dataplus._M_p;
  local_78._0_8_ = (pointer)0x0;
  local_78._8_8_ = (pointer)0x0;
  local_78._16_8_ = 0;
  messenger = cmake::GetMessenger(this->GlobalGenerator->CMakeInstance);
  bVar2 = cmListFile::ParseFile((cmListFile *)local_78,filename_00._M_p,messenger,&this->Backtrace);
  if (bVar2) {
    ReadListFile(this,(cmListFile *)local_78,&local_98);
    if (cmSystemTools::s_FatalErrorOccured == false) {
      bVar3 = cmSystemTools::GetInterruptFlag();
      if (!bVar3) goto LAB_003c8836;
    }
    local_48[10] = false;
  }
LAB_003c8836:
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector
            ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)local_78);
  IncludeScope::~IncludeScope((IncludeScope *)local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool cmMakefile::ReadDependentFile(const char* filename, bool noPolicyScope)
{
  this->AddDefinition("CMAKE_PARENT_LIST_FILE",
                      this->GetDefinition("CMAKE_CURRENT_LIST_FILE"));
  std::string filenametoread = cmSystemTools::CollapseFullPath(
    filename, this->GetCurrentSourceDirectory());

  IncludeScope incScope(this, filenametoread, noPolicyScope);

  cmListFile listFile;
  if (!listFile.ParseFile(filenametoread.c_str(), this->GetMessenger(),
                          this->Backtrace)) {
    return false;
  }

  this->ReadListFile(listFile, filenametoread);
  if (cmSystemTools::GetFatalErrorOccured()) {
    incScope.Quiet();
  }
  return true;
}